

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

SolveStatus
cptp_solve(Instance *instance,char *solver_name,SolverParams *params,Solution *solution,
          double timelimit,int32_t randomseed)

{
  _Bool _Var1;
  SolverLookup *pSVar2;
  time_t tVar3;
  __sighandler_t __handler;
  Instance *__handler_00;
  int64_t iVar4;
  undefined7 extraout_var;
  Solution *extraout_RDX;
  long *in_FS_OFFSET;
  int64_t begin_time;
  sighandler_t prev_sigint_handler;
  sighandler_t prev_sigterm_handler;
  Solver solver;
  SolverTypedParams tparams;
  SolverLookup *lookup;
  SolveStatus status;
  int32_t randomseed_local;
  double timelimit_local;
  Solution *solution_local;
  SolverParams *params_local;
  char *solver_name_local;
  Instance *instance_local;
  
  pSVar2 = lookup_solver(solver_name);
  if (pSVar2 == (SolverLookup *)0x0) {
    log_log(0x80,
            "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core.c"
            ,0x1bb,"%s :: `%s` is not a know solver","cptp_solve",solver_name);
  }
  else {
    log_log(0x20,
            "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core.c"
            ,0x1bf,"%s :: Found descriptor for solver `%s`","cptp_solve",solver_name);
    lookup._4_4_ = randomseed;
    if (randomseed == 0) {
      tVar3 = time((time_t *)0x0);
      lookup._4_4_ = (uint)(tVar3 % 0x7fffffff);
    }
    printf("%s :: Setting seed = %d\n","cptp_solve",(ulong)lookup._4_4_);
    srand(lookup._4_4_);
    printf("%s :: Setting timelimit = %f\n",timelimit,"cptp_solve");
    _Var1 = verify_solver_params(pSVar2->descriptor,params);
    if (_Var1) {
      memset(&solver.destroy,0,8);
      _Var1 = resolve_params(params,pSVar2->descriptor,(SolverTypedParams *)&solver.destroy);
      if (_Var1) {
        (*pSVar2->create_fn)
                  ((Solver *)&prev_sigterm_handler,instance,(SolverTypedParams *)&solver.destroy,
                   timelimit,lookup._4_4_);
        solver.data._0_1_ = 0;
        solver.data._4_4_ = 0;
        *(sighandler_t **)(*in_FS_OFFSET + -8) = &prev_sigterm_handler;
        __handler = signal(0xf,cptp_sighandler);
        __handler_00 = (Instance *)signal(2,cptp_sighandler);
        iVar4 = os_get_usecs();
        _Var1 = (*solver.set_params)((Solver *)&prev_sigterm_handler,(SolverParams *)instance);
        lookup._0_4_ = (SolveStatus)CONCAT71(extraout_var,_Var1);
        signal(0xf,__handler);
        signal(2,(__sighandler_t)__handler_00);
        *(undefined8 *)(*in_FS_OFFSET + -8) = 0;
        if (((byte)solver.data & 1) != 0) {
          lookup._0_4_ = (SolveStatus)lookup | SOLVE_STATUS_ABORTION_SIGTERM;
        }
        (*solver.solve)((Solver *)&prev_sigterm_handler,__handler_00,extraout_RDX,iVar4);
        log_solve_status((SolveStatus)lookup,solver_name);
        postprocess_solver_solution(instance,(SolveStatus)lookup,solution);
        solver_typed_params_destroy((SolverTypedParams *)&solver.destroy);
        return (SolveStatus)lookup;
      }
      fprintf(_stderr,"ERROR: %s :: Failed to resolve parameters\n","cptp_solve");
    }
    else {
      fprintf(_stderr,"ERROR: %s :: Failed to verify params\n","cptp_solve");
    }
  }
  solution_clear(solution);
  return SOLVE_STATUS_NULL;
}

Assistant:

SolveStatus cptp_solve(const Instance *instance, const char *solver_name,
                       const SolverParams *params, Solution *solution,
                       double timelimit, int32_t randomseed) {
    SolveStatus status = SOLVE_STATUS_NULL;
    const SolverLookup *lookup = lookup_solver(solver_name);

    if (lookup == NULL) {
        log_fatal("%s :: `%s` is not a know solver", __func__, solver_name);
        goto fail;
    } else {
        log_info("%s :: Found descriptor for solver `%s`", __func__,
                 solver_name);
    }

    if (randomseed == 0) {
        randomseed = (int32_t)(time(NULL) % INT32_MAX);
    }

    printf("%s :: Setting seed = %d\n", __func__, randomseed);
    srand(randomseed);

    printf("%s :: Setting timelimit = %f\n", __func__, timelimit);

    if (!verify_solver_params(lookup->descriptor, params)) {
        fprintf(stderr, "ERROR: %s :: Failed to verify params\n", __func__);
        goto fail;
    }

    SolverTypedParams tparams = {0};

    if (!resolve_params(params, lookup->descriptor, &tparams)) {
        fprintf(stderr, "ERROR: %s :: Failed to resolve parameters\n",
                __func__);
        goto fail;
    }

    Solver solver =
        lookup->create_fn(instance, &tparams, timelimit, randomseed);

    {
        solver.sigterm_occured = false;
        solver.sigterm_occured_int = 0;

        // Setup signals
        sighandler_ctx_solver_ptr = &solver;
        sighandler_t prev_sigterm_handler = signal(SIGTERM, cptp_sighandler);
        sighandler_t prev_sigint_handler = signal(SIGINT, cptp_sighandler);
        {
            int64_t begin_time = os_get_usecs();
            status = solver.solve(&solver, instance, solution, begin_time);
        }
        // Resets the signals
        signal(SIGTERM, prev_sigterm_handler);
        signal(SIGINT, prev_sigint_handler);
        sighandler_ctx_solver_ptr = NULL;
    }

    if (solver.sigterm_occured) {
        status |= SOLVE_STATUS_ABORTION_SIGTERM;
    }

    solver.destroy(&solver);
    log_solve_status(status, solver_name);
    postprocess_solver_solution(instance, status, solution);
    solver_typed_params_destroy(&tparams);
    return status;

fail:
    solution_clear(solution);
    return status;
}